

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

QModelIndex * __thiscall
QtPrivate::QCalendarView::moveCursor
          (QCalendarView *this,CursorAction cursorAction,KeyboardModifiers modifiers)

{
  YearMonthDay YVar1;
  YearMonthDay YVar2;
  YearMonthDay YVar3;
  bool bVar4;
  int iVar5;
  QCalendarModel *pQVar6;
  QAbstractItemModel *this_00;
  int in_ECX;
  undefined4 in_EDX;
  long in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  QCalendarModel *calendarModel;
  YearMonthDay parts_1;
  CursorAction in_stack_000000b4;
  QTableView *in_stack_000000b8;
  YearMonthDay parts;
  QDate currentDate;
  QModelIndex index;
  QCalendar cal;
  KeyboardModifiers in_stack_000001f0;
  QCalendarView *in_stack_fffffffffffffeb8;
  QCalendarModel *in_stack_fffffffffffffec0;
  undefined1 *puVar7;
  undefined1 _t2;
  QDate _t1;
  QAbstractItemView *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  YearMonthDay local_a0;
  undefined1 *local_90;
  YearMonthDay local_88;
  qint64 local_78;
  YearMonthDay local_70;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_28;
  undefined1 *local_18;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_ECX;
  QAbstractItemView::model(in_stack_fffffffffffffed0);
  pQVar6 = qobject_cast<QtPrivate::QCalendarModel*>((QObject *)0x51a07d);
  if (pQVar6 == (QCalendarModel *)0x0) {
    local_10 = local_c;
    QTableView::moveCursor(in_stack_000000b8,in_stack_000000b4,in_stack_000001f0);
  }
  else {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = (undefined1 *)QCalendarModel::calendar(in_stack_fffffffffffffec0);
    if ((*(byte *)(in_RSI + 0x28) & 1) == 0) {
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
      puVar7 = &DAT_aaaaaaaaaaaaaaaa;
      local_28.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      _t1.jd = (qint64)&local_38;
      QAbstractItemView::currentIndex(in_stack_fffffffffffffed0);
      local_40 = puVar7;
      this_00 = QAbstractItemView::model(in_stack_fffffffffffffed0);
      _t2 = (undefined1)((ulong)puVar7 >> 0x38);
      iVar5 = QModelIndex::row((QModelIndex *)_t1.jd);
      QModelIndex::column((QModelIndex *)_t1.jd);
      local_40 = (undefined1 *)
                 QCalendarModel::dateForCell
                           ((QCalendarModel *)CONCAT44(iVar5,in_stack_fffffffffffffed8),
                            (int)((ulong)this_00 >> 0x20),(int)this_00);
      YVar3.day = local_a0.day;
      YVar3.year = local_a0.year;
      YVar3.month = local_a0.month;
      YVar2.day = local_70.day;
      YVar2.year = local_70.year;
      YVar2.month = local_70.month;
      YVar1.day = local_88.day;
      YVar1.year = local_88.year;
      YVar1.month = local_88.month;
      switch(in_EDX) {
      case 0:
        local_48 = (undefined1 *)QDate::addDays((longlong)&local_40);
        YVar3.day = local_a0.day;
        YVar3.year = local_a0.year;
        YVar3.month = local_a0.month;
        YVar2.day = local_70.day;
        YVar2.year = local_70.year;
        YVar2.month = local_70.month;
        YVar1.day = local_88.day;
        YVar1.year = local_88.year;
        YVar1.month = local_88.month;
        local_40 = local_48;
        break;
      case 1:
        local_50 = (undefined1 *)QDate::addDays((longlong)&local_40);
        YVar3.day = local_a0.day;
        YVar3.year = local_a0.year;
        YVar3.month = local_a0.month;
        YVar2.day = local_70.day;
        YVar2.year = local_70.year;
        YVar2.month = local_70.month;
        YVar1.day = local_88.day;
        YVar1.year = local_88.year;
        YVar1.month = local_88.month;
        local_40 = local_50;
        break;
      case 2:
        QWidget::isRightToLeft((QWidget *)0x51a216);
        local_58 = (undefined1 *)QDate::addDays((longlong)&local_40);
        YVar3.day = local_a0.day;
        YVar3.year = local_a0.year;
        YVar3.month = local_a0.month;
        YVar2.day = local_70.day;
        YVar2.year = local_70.year;
        YVar2.month = local_70.month;
        YVar1.day = local_88.day;
        YVar1.year = local_88.year;
        YVar1.month = local_88.month;
        local_40 = local_58;
        break;
      case 3:
        QWidget::isRightToLeft((QWidget *)0x51a25f);
        local_60 = (undefined1 *)QDate::addDays((longlong)&local_40);
        YVar3.day = local_a0.day;
        YVar3.year = local_a0.year;
        YVar3.month = local_a0.month;
        YVar2.day = local_70.day;
        YVar2.year = local_70.year;
        YVar2.month = local_70.month;
        YVar1.day = local_88.day;
        YVar1.year = local_88.year;
        YVar1.month = local_88.month;
        local_40 = local_60;
        break;
      case 4:
        local_70._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_70.day = -0x55555556;
        local_78 = (qint64)local_40;
        local_88 = (YearMonthDay)QCalendar::partsFromDate((QDate *)&local_18);
        local_70 = local_88;
        bVar4 = QCalendar::YearMonthDay::isValid(&local_70);
        YVar3.day = local_a0.day;
        YVar3.year = local_a0.year;
        YVar3.month = local_a0.month;
        YVar1 = local_88;
        YVar2 = local_70;
        if (bVar4) {
          local_70.day = 1;
          local_90 = (undefined1 *)QCalendar::dateFromParts((YearMonthDay *)&local_18);
          YVar3.day = local_a0.day;
          YVar3.year = local_a0.year;
          YVar3.month = local_a0.month;
          YVar2.day = local_70.day;
          YVar2.year = local_70.year;
          YVar2.month = local_70.month;
          local_40 = local_90;
          YVar1 = local_88;
        }
        break;
      case 5:
        local_a0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_a0.day = -0x55555556;
        local_a0 = (YearMonthDay)QCalendar::partsFromDate((QDate *)&local_18);
        bVar4 = QCalendar::YearMonthDay::isValid(&local_a0);
        YVar2.day = local_70.day;
        YVar2.year = local_70.year;
        YVar2.month = local_70.month;
        YVar1.day = local_88.day;
        YVar1.year = local_88.year;
        YVar1.month = local_88.month;
        YVar3 = local_a0;
        if (bVar4) {
          iVar5 = QCalendar::daysInMonth((int)&local_18,local_a0.month);
          local_a0.day = iVar5;
          local_40 = (undefined1 *)QCalendar::dateFromParts((YearMonthDay *)&local_18);
          YVar3.day = local_a0.day;
          YVar3.year = local_a0.year;
          YVar3.month = local_a0.month;
          YVar2.day = local_70.day;
          YVar2.year = local_70.year;
          YVar2.month = local_70.month;
          YVar1.day = local_88.day;
          YVar1.year = local_88.year;
          YVar1.month = local_88.month;
        }
        break;
      case 6:
        local_40 = (undefined1 *)QDate::addMonths(&local_40,0xffffffff,local_18);
        YVar3.day = local_a0.day;
        YVar3.year = local_a0.year;
        YVar3.month = local_a0.month;
        YVar2.day = local_70.day;
        YVar2.year = local_70.year;
        YVar2.month = local_70.month;
        YVar1.day = local_88.day;
        YVar1.year = local_88.year;
        YVar1.month = local_88.month;
        break;
      case 7:
        local_40 = (undefined1 *)QDate::addMonths(&local_40,1,local_18);
        YVar3.day = local_a0.day;
        YVar3.year = local_a0.year;
        YVar3.month = local_a0.month;
        YVar2.day = local_70.day;
        YVar2.year = local_70.year;
        YVar2.month = local_70.month;
        YVar1.day = local_88.day;
        YVar1.year = local_88.year;
        YVar1.month = local_88.month;
        break;
      case 8:
      case 9:
        QAbstractItemView::currentIndex((QAbstractItemView *)this_00);
        goto LAB_0051a4ec;
      }
      local_88 = YVar1;
      local_a0 = YVar3;
      local_70 = YVar2;
      changeDate(in_stack_fffffffffffffeb8,_t1,(bool)_t2);
      QAbstractItemView::currentIndex((QAbstractItemView *)this_00);
    }
    else {
      QAbstractItemView::currentIndex(in_stack_fffffffffffffed0);
    }
  }
LAB_0051a4ec:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QCalendarView::moveCursor(CursorAction cursorAction, Qt::KeyboardModifiers modifiers)
{
    QCalendarModel *calendarModel = qobject_cast<QCalendarModel *>(model());
    if (!calendarModel)
        return QTableView::moveCursor(cursorAction, modifiers);

    QCalendar cal = calendarModel->calendar();

    if (readOnly)
        return currentIndex();

    QModelIndex index = currentIndex();
    QDate currentDate = static_cast<QCalendarModel*>(model())->dateForCell(index.row(), index.column());
    switch (cursorAction) {
        case QAbstractItemView::MoveUp:
            currentDate = currentDate.addDays(-7);
            break;
        case QAbstractItemView::MoveDown:
            currentDate = currentDate.addDays(7);
            break;
        case QAbstractItemView::MoveLeft:
            currentDate = currentDate.addDays(isRightToLeft() ? 1 : -1);
            break;
        case QAbstractItemView::MoveRight:
            currentDate = currentDate.addDays(isRightToLeft() ? -1 : 1);
            break;
        case QAbstractItemView::MoveHome: {
            auto parts = cal.partsFromDate(currentDate);
            if (parts.isValid()) {
                parts.day = 1;
                currentDate = cal.dateFromParts(parts);
            }
        }
            break;
        case QAbstractItemView::MoveEnd: {
            auto parts = cal.partsFromDate(currentDate);
            if (parts.isValid()) {
                parts.day = cal.daysInMonth(parts.month, parts.year);
                currentDate = cal.dateFromParts(parts);
            }
        }
            break;
        case QAbstractItemView::MovePageUp:
            currentDate = currentDate.addMonths(-1, cal);
            break;
        case QAbstractItemView::MovePageDown:
            currentDate = currentDate.addMonths(1, cal);
            break;
        case QAbstractItemView::MoveNext:
        case QAbstractItemView::MovePrevious:
            return currentIndex();
        default:
            break;
    }
    emit changeDate(currentDate, true);
    return currentIndex();
}